

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

pa_sample_format_t to_pulse_format(cubeb_sample_format format)

{
  cubeb_sample_format format_local;
  pa_sample_format_t local_4;
  
  switch(format) {
  case CUBEB_SAMPLE_S16LE:
    local_4 = PA_SAMPLE_S16LE;
    break;
  case CUBEB_SAMPLE_S16BE:
    local_4 = PA_SAMPLE_S16BE;
    break;
  case CUBEB_SAMPLE_FLOAT32LE:
    local_4 = PA_SAMPLE_FLOAT32LE;
    break;
  case CUBEB_SAMPLE_FLOAT32BE:
    local_4 = PA_SAMPLE_FLOAT32BE;
    break;
  default:
    local_4 = PA_SAMPLE_INVALID;
  }
  return local_4;
}

Assistant:

static pa_sample_format_t
to_pulse_format(cubeb_sample_format format)
{
  switch (format) {
  case CUBEB_SAMPLE_S16LE:
    return PA_SAMPLE_S16LE;
  case CUBEB_SAMPLE_S16BE:
    return PA_SAMPLE_S16BE;
  case CUBEB_SAMPLE_FLOAT32LE:
    return PA_SAMPLE_FLOAT32LE;
  case CUBEB_SAMPLE_FLOAT32BE:
    return PA_SAMPLE_FLOAT32BE;
  default:
    return PA_SAMPLE_INVALID;
  }
}